

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.c
# Opt level: O0

size_t BrotliZopfliComputeShortestPath
                 (MemoryManager *m,size_t num_bytes,size_t position,uint8_t *ringbuffer,
                 size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                 int *dist_cache,H10 *hasher,ZopfliNode *nodes)

{
  uint uVar1;
  BackwardMatch *pBVar2;
  uint uVar3;
  int iVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong local_21d8;
  ulong local_21c0;
  ulong local_21b0;
  ulong local_2188;
  uint local_2180;
  ulong local_2170;
  size_t local_2168;
  ulong local_2158;
  ulong local_2150;
  size_t local_2140;
  ulong local_2128;
  ulong local_2118;
  size_t skip;
  size_t num_matches;
  size_t max_distance;
  size_t pos;
  size_t i;
  size_t store_end;
  BackwardMatch matches [128];
  undefined1 local_1ce0 [8];
  StartPosQueue queue;
  ZopfliCostModel model;
  size_t max_zopfli_len;
  BrotliEncoderParams *params_local;
  size_t ringbuffer_mask_local;
  uint8_t *ringbuffer_local;
  size_t position_local;
  size_t num_bytes_local;
  MemoryManager *m_local;
  ulong uStack_830;
  uint32_t dict_id;
  size_t l;
  size_t maxlen;
  size_t minlen;
  size_t len;
  size_t backward;
  size_t prev_ix;
  size_t i_1;
  uint32_t dict_matches [38];
  ulong local_758;
  size_t stop;
  size_t short_match_max_backward;
  size_t best_len;
  size_t cur_ix_masked;
  BackwardMatch *orig_matches;
  BrotliEncoderParams *local_728;
  ulong local_720;
  ulong local_718;
  ulong local_710;
  size_t local_708;
  uint8_t *local_700;
  H10 *local_6f8;
  ulong local_6f0;
  undefined8 local_6e8;
  size_t *local_6e0;
  size_t *local_6d8;
  BackwardMatch *local_6d0;
  ulong local_6c8;
  undefined8 local_6c0;
  ulong local_6b8;
  ulong local_6b0;
  ulong local_6a8;
  size_t j;
  size_t i_2;
  ulong local_690;
  ulong local_688;
  uint8_t *local_680;
  H10 *local_678;
  ulong local_670;
  size_t matching_bits;
  uint64_t x;
  size_t limit2;
  size_t matched;
  ulong *local_648;
  uint8_t *local_640;
  size_t local_638;
  ulong local_630;
  ulong local_628;
  BackwardMatch *local_620;
  ulong local_618;
  size_t len_1;
  size_t cur_len;
  size_t prev_ix_masked;
  size_t backward_1;
  size_t depth_remaining;
  size_t best_len_right;
  size_t best_len_left;
  size_t node_right;
  size_t node_left;
  size_t prev_ix_1;
  uint32_t key;
  int should_reroot_tree;
  size_t max_comp_len;
  size_t cur_ix_masked_1;
  ulong *local_5a8;
  ulong local_5a0;
  ulong local_598;
  size_t local_590;
  ulong local_588;
  uint8_t *local_580;
  H10 *local_578;
  size_t local_570;
  size_t local_568;
  undefined8 local_560;
  ulong local_558;
  ulong local_550;
  size_t matching_bits_1;
  uint64_t x_1;
  size_t limit2_1;
  size_t matched_1;
  ulong *local_528;
  uint8_t *local_520;
  size_t local_518;
  ulong local_510;
  size_t local_508;
  size_t local_500;
  ulong local_4f8;
  ulong local_4f0;
  long local_4e8;
  BackwardMatch *local_4e0;
  ulong local_4d8;
  uint64_t t_7;
  ulong local_4c8;
  uint64_t t_6;
  ulong local_4b8;
  uint64_t t_5;
  ulong local_4a8;
  uint64_t t_4;
  ulong local_498;
  uint64_t t_3;
  ulong local_488;
  uint64_t t_2;
  ulong local_478;
  uint64_t t_1;
  ulong local_468;
  uint64_t t;
  size_t local_458;
  H10 *local_450;
  size_t local_448;
  H10 *local_440;
  ulong local_438;
  H10 *local_430;
  size_t local_428;
  H10 *local_420;
  size_t local_418;
  H10 *local_410;
  ulong local_408;
  H10 *local_400;
  ulong local_3f8;
  size_t max_backward;
  ulong local_3e8;
  uint8_t *local_3e0;
  H10 *local_3d8;
  ulong local_3d0;
  size_t len_2;
  size_t cur_len_1;
  size_t prev_ix_masked_1;
  size_t backward_2;
  size_t depth_remaining_1;
  size_t best_len_right_1;
  size_t best_len_left_1;
  size_t node_right_1;
  size_t node_left_1;
  size_t prev_ix_2;
  uint32_t key_1;
  int should_reroot_tree_1;
  size_t max_comp_len_1;
  size_t cur_ix_masked_2;
  ulong *local_360;
  ulong local_358;
  long local_350;
  ulong local_348;
  ulong local_340;
  uint8_t *local_338;
  H10 *local_330;
  size_t local_328;
  size_t local_320;
  undefined8 local_318;
  undefined8 local_310;
  ulong local_308;
  size_t matching_bits_2;
  uint64_t x_2;
  size_t limit2_2;
  size_t matched_2;
  ulong *local_2e0;
  uint8_t *local_2d8;
  size_t local_2d0;
  ulong local_2c8;
  size_t local_2c0;
  size_t local_2b8;
  ulong local_2b0;
  uint64_t t_11;
  ulong local_2a0;
  uint64_t t_10;
  ulong local_290;
  uint64_t t_9;
  ulong local_280;
  uint64_t t_8;
  size_t local_270;
  H10 *local_268;
  size_t local_260;
  H10 *local_258;
  ulong local_250;
  H10 *local_248;
  size_t local_240;
  H10 *local_238;
  size_t local_230;
  H10 *local_228;
  ulong local_220;
  H10 *local_218;
  ulong local_210;
  size_t max_backward_1;
  ulong local_200;
  uint8_t *local_1f8;
  H10 *local_1f0;
  ulong local_1e8;
  size_t len_3;
  size_t cur_len_2;
  size_t prev_ix_masked_2;
  size_t backward_3;
  size_t depth_remaining_2;
  size_t best_len_right_2;
  size_t best_len_left_2;
  size_t node_right_2;
  size_t node_left_2;
  size_t prev_ix_3;
  uint32_t key_2;
  int should_reroot_tree_2;
  size_t max_comp_len_2;
  size_t cur_ix_masked_3;
  ulong *local_178;
  ulong local_170;
  long local_168;
  ulong local_160;
  size_t local_158;
  uint8_t *local_150;
  H10 *local_148;
  size_t local_140;
  size_t local_138;
  undefined8 local_130;
  undefined8 local_128;
  ulong local_120;
  size_t matching_bits_3;
  uint64_t x_3;
  size_t limit2_3;
  size_t matched_3;
  ulong *local_f8;
  uint8_t *local_f0;
  size_t local_e8;
  ulong local_e0;
  size_t local_d8;
  size_t local_d0;
  ulong local_c8;
  uint64_t t_15;
  ulong local_b8;
  uint64_t t_14;
  ulong local_a8;
  uint64_t t_13;
  ulong local_98;
  uint64_t t_12;
  size_t local_88;
  H10 *local_80;
  size_t local_78;
  H10 *local_70;
  ulong local_68;
  H10 *local_60;
  size_t local_58;
  H10 *local_50;
  size_t local_48;
  H10 *local_40;
  ulong local_38;
  H10 *local_30;
  
  uVar3 = 0x145;
  if (params->quality < 0xb) {
    uVar3 = 0x96;
  }
  sVar5 = StoreLookaheadH10();
  local_2128 = position;
  if (sVar5 <= num_bytes) {
    sVar5 = StoreLookaheadH10();
    local_2128 = ((position + num_bytes) - sVar5) + 1;
  }
  nodes->length = 0;
  (nodes->u).cost = 0.0;
  InitZopfliCostModel(m,(ZopfliCostModel *)&queue.idx_,num_bytes);
  ZopfliCostModelSetFromLiteralCosts
            ((ZopfliCostModel *)&queue.idx_,position,ringbuffer,ringbuffer_mask);
  queue.q_[7].costdiff = 0.0;
  queue.q_[7].cost = 0.0;
  pos = 0;
  do {
    sVar5 = HashTypeLengthH10();
    if (num_bytes <= (pos + sVar5) - 1) {
      CleanupZopfliCostModel(m,(ZopfliCostModel *)&queue.idx_);
      sVar5 = ComputeShortestPathFromNodes(num_bytes,nodes);
      return sVar5;
    }
    uVar6 = position + pos;
    local_2140 = uVar6;
    if (max_backward_limit <= uVar6) {
      local_2140 = max_backward_limit;
    }
    local_718 = num_bytes - pos;
    cur_ix_masked = (size_t)&store_end;
    local_6f8 = hasher;
    local_720 = local_2140;
    best_len = uVar6 & ringbuffer_mask;
    short_match_max_backward = 1;
    iVar4 = 0x40;
    if (params->quality != 0xb) {
      iVar4 = 0x10;
    }
    local_758 = uVar6 - (long)iVar4;
    orig_matches = (BackwardMatch *)cur_ix_masked;
    prev_ix = uVar6;
    if (uVar6 < (ulong)(long)iVar4) {
      local_758 = 0;
      orig_matches = (BackwardMatch *)cur_ix_masked;
    }
    while ((prev_ix = prev_ix - 1, local_758 < prev_ix && short_match_max_backward < 3 &&
           (uVar8 = uVar6 - prev_ix, uVar8 <= local_2140))) {
      uVar7 = ringbuffer_mask & prev_ix;
      if ((ringbuffer[best_len] == ringbuffer[uVar7]) &&
         (ringbuffer[best_len + 1] == ringbuffer[uVar7 + 1])) {
        local_640 = ringbuffer + uVar7;
        local_648 = (ulong *)(ringbuffer + best_len);
        limit2 = 0;
        x = (local_718 >> 3) + 1;
LAB_00126aa9:
        x = x - 1;
        if (x != 0) {
          t = (uint64_t)local_648;
          local_468 = *local_648;
          t_1 = (uint64_t)(local_640 + limit2);
          local_478 = *(ulong *)t_1;
          if (local_468 == local_478) goto LAB_00126b27;
          t_2 = (uint64_t)local_648;
          local_488 = *local_648;
          t_3 = (uint64_t)(local_640 + limit2);
          local_498 = *(ulong *)t_3;
          iVar4 = 0;
          matching_bits = local_488 ^ local_498;
          for (uVar7 = matching_bits; (uVar7 & 1) == 0; uVar7 = uVar7 >> 1 | 0x8000000000000000) {
            iVar4 = iVar4 + 1;
          }
          local_670 = (ulong)iVar4;
          local_638 = (local_670 >> 3) + limit2;
          matched = local_718;
          goto LAB_00126c84;
        }
        matched = (local_718 & 7) + 1;
        while (matched = matched - 1, matched != 0) {
          if (local_640[limit2] != (uint8_t)*local_648) {
            local_638 = limit2;
            goto LAB_00126c84;
          }
          local_648 = (ulong *)((long)local_648 + 1);
          limit2 = limit2 + 1;
        }
        local_638 = limit2;
LAB_00126c84:
        limit2 = local_638;
        if (short_match_max_backward < local_638) {
          short_match_max_backward = local_638;
          local_620 = orig_matches;
          local_630 = local_638;
          orig_matches->distance = (uint32_t)uVar8;
          orig_matches->length_and_code = (uint32_t)(local_638 << 5);
          orig_matches = orig_matches + 1;
          local_628 = uVar8;
        }
      }
    }
    local_728 = params;
    local_710 = uVar6;
    local_708 = ringbuffer_mask;
    local_700 = ringbuffer;
    if (short_match_max_backward < local_718) {
      local_578 = hasher;
      local_5a0 = local_2140;
      local_5a8 = &short_match_max_backward;
      cur_ix_masked_1 = (size_t)orig_matches;
      max_comp_len = uVar6 & ringbuffer_mask;
      local_560 = 0x80;
      local_2150 = local_718;
      if (0x7f < local_718) {
        local_2150 = 0x80;
      }
      _key = local_2150;
      prev_ix_1._4_4_ = (uint)(0x7f < local_718);
      local_598 = local_718;
      local_590 = ringbuffer_mask;
      local_588 = uVar6;
      local_580 = ringbuffer;
      local_558 = local_718;
      prev_ix_1._0_4_ = HashBytesH10(ringbuffer + max_comp_len);
      uVar1 = local_578->buckets_[(uint32_t)prev_ix_1];
      local_430 = local_578;
      local_438 = local_588;
      node_right = (local_588 & local_578->window_mask_) << 1;
      local_400 = local_578;
      local_408 = local_588;
      best_len_left = (local_588 & local_578->window_mask_) * 2 + 1;
      best_len_right = 0;
      depth_remaining = 0;
      if (prev_ix_1._4_4_ != 0) {
        local_578->buckets_[(uint32_t)prev_ix_1] = (uint32_t)local_588;
      }
      backward_1 = 0x40;
      while( true ) {
        node_left = (size_t)uVar1;
        prev_ix_masked = local_588 - node_left;
        cur_len = node_left & local_590;
        if (((prev_ix_masked == 0) || (local_5a0 < prev_ix_masked)) || (backward_1 == 0)) break;
        local_568 = best_len_right;
        local_570 = depth_remaining;
        if (best_len_right < depth_remaining) {
          local_2158 = best_len_right;
        }
        else {
          local_2158 = depth_remaining;
        }
        len_1 = local_2158;
        if (0x80 < local_2158) {
          __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                        ,0x9d,
                        "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                       );
        }
        local_520 = local_580 + max_comp_len + local_2158;
        local_528 = (ulong *)(local_580 + cur_len + local_2158);
        matched_1 = local_598 - local_2158;
        limit2_1 = 0;
        x_1 = (matched_1 >> 3) + 1;
LAB_001270cf:
        x_1 = x_1 - 1;
        if (x_1 != 0) {
          t_4 = (uint64_t)local_528;
          local_4a8 = *local_528;
          t_5 = (uint64_t)(local_520 + limit2_1);
          local_4b8 = *(ulong *)t_5;
          if (local_4a8 == local_4b8) goto LAB_0012714d;
          t_6 = (uint64_t)local_528;
          local_4c8 = *local_528;
          t_7 = (uint64_t)(local_520 + limit2_1);
          local_4d8 = *(ulong *)t_7;
          iVar4 = 0;
          matching_bits_1 = local_4c8 ^ local_4d8;
          for (uVar8 = matching_bits_1; (uVar8 & 1) == 0; uVar8 = uVar8 >> 1 | 0x8000000000000000) {
            iVar4 = iVar4 + 1;
          }
          local_550 = (ulong)iVar4;
          local_518 = (local_550 >> 3) + limit2_1;
          goto LAB_001272aa;
        }
        matched_1 = (matched_1 & 7) + 1;
        while (matched_1 = matched_1 - 1, matched_1 != 0) {
          if (local_520[limit2_1] != (uint8_t)*local_528) {
            local_518 = limit2_1;
            goto LAB_001272aa;
          }
          local_528 = (ulong *)((long)local_528 + 1);
          limit2_1 = limit2_1 + 1;
        }
        local_518 = limit2_1;
LAB_001272aa:
        local_618 = local_2158 + local_518;
        limit2_1 = local_518;
        iVar4 = memcmp(local_580 + max_comp_len,local_580 + cur_len,local_618);
        if (iVar4 != 0) {
          __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                        ,0xa2,
                        "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                       );
        }
        if ((cur_ix_masked_1 != 0) && (*local_5a8 < local_618)) {
          *local_5a8 = local_618;
          local_500 = cur_ix_masked_1;
          local_508 = prev_ix_masked;
          local_510 = local_618;
          *(int *)cur_ix_masked_1 = (int)prev_ix_masked;
          *(int *)(cur_ix_masked_1 + 4) = (int)(local_618 << 5);
          cur_ix_masked_1 = cur_ix_masked_1 + 8;
        }
        if (_key <= local_618) {
          if (prev_ix_1._4_4_ != 0) {
            local_450 = local_578;
            local_458 = node_left;
            local_578->forest_[node_right] =
                 local_578->forest_[(node_left & local_578->window_mask_) * 2];
            local_420 = local_578;
            local_428 = node_left;
            local_578->forest_[best_len_left] =
                 local_578->forest_[(node_left & local_578->window_mask_) * 2 + 1];
          }
          goto LAB_001275f1;
        }
        if (local_580[cur_len + local_618] < local_580[max_comp_len + local_618]) {
          best_len_right = local_618;
          if (prev_ix_1._4_4_ != 0) {
            local_578->forest_[node_right] = (uint32_t)node_left;
          }
          local_410 = local_578;
          local_418 = node_left;
          node_right = (node_left & local_578->window_mask_) * 2 + 1;
          uVar1 = local_578->forest_[node_right];
        }
        else {
          depth_remaining = local_618;
          if (prev_ix_1._4_4_ != 0) {
            local_578->forest_[best_len_left] = (uint32_t)node_left;
          }
          local_440 = local_578;
          local_448 = node_left;
          uVar8 = node_left & local_578->window_mask_;
          best_len_left = uVar8 * 2;
          uVar1 = local_578->forest_[uVar8 * 2];
        }
        backward_1 = backward_1 - 1;
      }
      if (prev_ix_1._4_4_ != 0) {
        local_578->forest_[node_right] = local_578->invalid_pos_;
        local_578->forest_[best_len_left] = local_578->invalid_pos_;
      }
LAB_001275f1:
      orig_matches = (BackwardMatch *)cur_ix_masked_1;
    }
    for (prev_ix = 0; prev_ix < 0x26; prev_ix = prev_ix + 1) {
      dict_matches[prev_ix - 2] = 0xfffffff;
    }
    local_6c8 = short_match_max_backward + 1;
    local_6c0 = 4;
    local_2168 = local_6c8;
    if (local_6c8 < 4) {
      local_2168 = 4;
    }
    iVar4 = BrotliFindAllStaticDictionaryMatches
                      (local_700 + best_len,local_2168,local_718,(uint32_t *)&i_1);
    if (iVar4 != 0) {
      local_6e8 = 0x25;
      local_6f0 = local_718;
      if (local_718 < 0x26) {
        local_2170 = local_718;
      }
      else {
        local_2170 = 0x25;
      }
      for (uStack_830 = local_2168; pBVar2 = orig_matches, uStack_830 <= local_2170;
          uStack_830 = uStack_830 + 1) {
        local_2180 = dict_matches[uStack_830 - 2];
        if (local_2180 < 0xfffffff) {
          orig_matches = orig_matches + 1;
          local_4e8 = local_720 + (local_2180 >> 5) + 1;
          local_2180 = local_2180 & 0x1f;
          local_4e0 = pBVar2;
          local_4f0 = uStack_830;
          local_4f8 = (ulong)local_2180;
          pBVar2->distance = (uint32_t)local_4e8;
          if (uStack_830 == local_2180) {
            local_2180 = 0;
          }
          pBVar2->length_and_code = (uint)(uStack_830 << 5) | local_2180;
        }
      }
    }
    skip = (long)((long)orig_matches - cur_ix_masked) >> 3;
    if ((skip != 0) &&
       (local_6d0 = matches + (skip - 2), uVar3 < matches[skip - 2].length_and_code >> 5)) {
      store_end = *(size_t *)(matches + (skip - 2));
      skip = 1;
    }
    local_2118 = UpdateNodes(num_bytes,position,pos,ringbuffer,ringbuffer_mask,params,
                             max_backward_limit,dist_cache,skip,(BackwardMatch *)&store_end,
                             (ZopfliCostModel *)&queue.idx_,(StartPosQueue *)local_1ce0,nodes);
    if (local_2118 < 0x4000) {
      local_2118 = 0;
    }
    if (skip == 1) {
      local_6d8 = &store_end;
      if (uVar3 < store_end._4_4_ >> 5) {
        local_6e0 = &store_end;
        local_6b0 = (ulong)(store_end._4_4_ >> 5);
        local_6b8 = local_2118;
        local_2188 = local_6b0;
        if (local_6b0 <= local_2118) {
          local_2188 = local_2118;
        }
        local_2118 = local_2188;
      }
    }
    if (1 < local_2118) {
      local_6a8 = uVar6 + 1;
      local_21b0 = uVar6 + local_2118;
      if (local_2128 <= local_21b0) {
        local_21b0 = local_2128;
      }
      local_678 = hasher;
      i_2 = local_21b0;
      j = local_6a8;
      if (uVar6 + 0x40 <= local_21b0) {
        j = local_21b0 - 0x3f;
      }
      local_690 = local_6a8;
      local_688 = ringbuffer_mask;
      local_680 = ringbuffer;
      if (uVar6 + 0x201 <= j) {
        for (; local_6a8 < j; local_6a8 = local_6a8 + 8) {
          local_3d8 = local_678;
          local_3e0 = local_680;
          local_3e8 = local_688;
          max_backward = local_6a8;
          local_3f8 = local_678->window_mask_ - 0xf;
          local_330 = local_678;
          local_338 = local_680;
          local_340 = local_6a8;
          local_348 = local_688;
          local_350 = 0x80;
          local_360 = (ulong *)0x0;
          cur_ix_masked_2 = 0;
          max_comp_len_1 = local_6a8 & local_688;
          local_310 = 0x80;
          local_318 = 0x80;
          _key_1 = 0x80;
          prev_ix_2._4_4_ = 1;
          local_358 = local_3f8;
          prev_ix_2._0_4_ = HashBytesH10(local_680 + max_comp_len_1);
          uVar1 = local_330->buckets_[(uint32_t)prev_ix_2];
          local_248 = local_330;
          local_250 = local_340;
          node_right_1 = (local_340 & local_330->window_mask_) << 1;
          local_218 = local_330;
          local_220 = local_340;
          best_len_left_1 = (local_340 & local_330->window_mask_) * 2 + 1;
          best_len_right_1 = 0;
          depth_remaining_1 = 0;
          if (prev_ix_2._4_4_ != 0) {
            local_330->buckets_[(uint32_t)prev_ix_2] = (uint32_t)local_340;
          }
          backward_2 = 0x40;
          while( true ) {
            node_left_1 = (size_t)uVar1;
            prev_ix_masked_1 = local_340 - node_left_1;
            cur_len_1 = node_left_1 & local_348;
            if (((prev_ix_masked_1 == 0) || (local_358 < prev_ix_masked_1)) || (backward_2 == 0))
            break;
            local_320 = best_len_right_1;
            local_328 = depth_remaining_1;
            if (best_len_right_1 < depth_remaining_1) {
              local_21c0 = best_len_right_1;
            }
            else {
              local_21c0 = depth_remaining_1;
            }
            len_2 = local_21c0;
            if (0x80 < local_21c0) {
              __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                            ,0x9d,
                            "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                           );
            }
            local_2d8 = local_338 + max_comp_len_1 + local_21c0;
            local_2e0 = (ulong *)(local_338 + cur_len_1 + local_21c0);
            matched_2 = local_350 - local_21c0;
            limit2_2 = 0;
            x_2 = (matched_2 >> 3) + 1;
LAB_00127f26:
            x_2 = x_2 - 1;
            if (x_2 != 0) {
              t_8 = (uint64_t)local_2e0;
              local_280 = *local_2e0;
              t_9 = (uint64_t)(local_2d8 + limit2_2);
              local_290 = *(ulong *)t_9;
              if (local_280 == local_290) goto LAB_00127fa4;
              t_10 = (uint64_t)local_2e0;
              local_2a0 = *local_2e0;
              t_11 = (uint64_t)(local_2d8 + limit2_2);
              local_2b0 = *(ulong *)t_11;
              iVar4 = 0;
              matching_bits_2 = local_2a0 ^ local_2b0;
              for (uVar6 = matching_bits_2; (uVar6 & 1) == 0;
                  uVar6 = uVar6 >> 1 | 0x8000000000000000) {
                iVar4 = iVar4 + 1;
              }
              local_308 = (ulong)iVar4;
              local_2d0 = (local_308 >> 3) + limit2_2;
              goto LAB_00128101;
            }
            matched_2 = (matched_2 & 7) + 1;
            while (matched_2 = matched_2 - 1, matched_2 != 0) {
              if (local_2d8[limit2_2] != (uint8_t)*local_2e0) {
                local_2d0 = limit2_2;
                goto LAB_00128101;
              }
              local_2e0 = (ulong *)((long)local_2e0 + 1);
              limit2_2 = limit2_2 + 1;
            }
            local_2d0 = limit2_2;
LAB_00128101:
            local_3d0 = local_21c0 + local_2d0;
            limit2_2 = local_2d0;
            iVar4 = memcmp(local_338 + max_comp_len_1,local_338 + cur_len_1,local_3d0);
            if (iVar4 != 0) {
              __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                            ,0xa2,
                            "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                           );
            }
            if ((cur_ix_masked_2 != 0) && (*local_360 < local_3d0)) {
              *local_360 = local_3d0;
              local_2b8 = cur_ix_masked_2;
              local_2c0 = prev_ix_masked_1;
              local_2c8 = local_3d0;
              *(int *)cur_ix_masked_2 = (int)prev_ix_masked_1;
              *(int *)(cur_ix_masked_2 + 4) = (int)(local_3d0 << 5);
              cur_ix_masked_2 = cur_ix_masked_2 + 8;
            }
            if (_key_1 <= local_3d0) {
              if (prev_ix_2._4_4_ != 0) {
                local_268 = local_330;
                local_270 = node_left_1;
                local_330->forest_[node_right_1] =
                     local_330->forest_[(node_left_1 & local_330->window_mask_) * 2];
                local_238 = local_330;
                local_240 = node_left_1;
                local_330->forest_[best_len_left_1] =
                     local_330->forest_[(node_left_1 & local_330->window_mask_) * 2 + 1];
              }
              goto LAB_00128448;
            }
            if (local_338[cur_len_1 + local_3d0] < local_338[max_comp_len_1 + local_3d0]) {
              best_len_right_1 = local_3d0;
              if (prev_ix_2._4_4_ != 0) {
                local_330->forest_[node_right_1] = (uint32_t)node_left_1;
              }
              local_228 = local_330;
              local_230 = node_left_1;
              node_right_1 = (node_left_1 & local_330->window_mask_) * 2 + 1;
              uVar1 = local_330->forest_[node_right_1];
            }
            else {
              depth_remaining_1 = local_3d0;
              if (prev_ix_2._4_4_ != 0) {
                local_330->forest_[best_len_left_1] = (uint32_t)node_left_1;
              }
              local_258 = local_330;
              local_260 = node_left_1;
              uVar6 = node_left_1 & local_330->window_mask_;
              best_len_left_1 = uVar6 * 2;
              uVar1 = local_330->forest_[uVar6 * 2];
            }
            backward_2 = backward_2 - 1;
          }
          if (prev_ix_2._4_4_ != 0) {
            local_330->forest_[node_right_1] = local_330->invalid_pos_;
            local_330->forest_[best_len_left_1] = local_330->invalid_pos_;
          }
LAB_00128448:
        }
      }
      for (; j < i_2; j = j + 1) {
        local_1f0 = local_678;
        local_1f8 = local_680;
        local_200 = local_688;
        max_backward_1 = j;
        local_210 = local_678->window_mask_ - 0xf;
        local_148 = local_678;
        local_150 = local_680;
        local_158 = j;
        local_160 = local_688;
        local_168 = 0x80;
        local_178 = (ulong *)0x0;
        cur_ix_masked_3 = 0;
        max_comp_len_2 = j & local_688;
        local_128 = 0x80;
        local_130 = 0x80;
        _key_2 = 0x80;
        prev_ix_3._4_4_ = 1;
        local_170 = local_210;
        prev_ix_3._0_4_ = HashBytesH10(local_680 + max_comp_len_2);
        uVar1 = local_148->buckets_[(uint32_t)prev_ix_3];
        local_60 = local_148;
        local_68 = local_158;
        node_right_2 = (local_158 & local_148->window_mask_) << 1;
        local_30 = local_148;
        local_38 = local_158;
        best_len_left_2 = (local_158 & local_148->window_mask_) * 2 + 1;
        best_len_right_2 = 0;
        depth_remaining_2 = 0;
        if (prev_ix_3._4_4_ != 0) {
          local_148->buckets_[(uint32_t)prev_ix_3] = (uint32_t)local_158;
        }
        backward_3 = 0x40;
        while( true ) {
          node_left_2 = (size_t)uVar1;
          prev_ix_masked_2 = local_158 - node_left_2;
          cur_len_2 = node_left_2 & local_160;
          if (((prev_ix_masked_2 == 0) || (local_170 < prev_ix_masked_2)) || (backward_3 == 0))
          break;
          local_138 = best_len_right_2;
          local_140 = depth_remaining_2;
          if (best_len_right_2 < depth_remaining_2) {
            local_21d8 = best_len_right_2;
          }
          else {
            local_21d8 = depth_remaining_2;
          }
          len_3 = local_21d8;
          if (0x80 < local_21d8) {
            __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                          ,0x9d,
                          "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                         );
          }
          local_f0 = local_150 + max_comp_len_2 + local_21d8;
          local_f8 = (ulong *)(local_150 + cur_len_2 + local_21d8);
          matched_3 = local_168 - local_21d8;
          limit2_3 = 0;
          x_3 = (matched_3 >> 3) + 1;
LAB_00128838:
          x_3 = x_3 - 1;
          if (x_3 != 0) {
            t_12 = (uint64_t)local_f8;
            local_98 = *local_f8;
            t_13 = (uint64_t)(local_f0 + limit2_3);
            local_a8 = *(ulong *)t_13;
            if (local_98 == local_a8) goto LAB_001288b6;
            t_14 = (uint64_t)local_f8;
            local_b8 = *local_f8;
            t_15 = (uint64_t)(local_f0 + limit2_3);
            local_c8 = *(ulong *)t_15;
            iVar4 = 0;
            matching_bits_3 = local_b8 ^ local_c8;
            for (uVar6 = matching_bits_3; (uVar6 & 1) == 0; uVar6 = uVar6 >> 1 | 0x8000000000000000)
            {
              iVar4 = iVar4 + 1;
            }
            local_120 = (ulong)iVar4;
            local_e8 = (local_120 >> 3) + limit2_3;
            goto LAB_00128a13;
          }
          matched_3 = (matched_3 & 7) + 1;
          while (matched_3 = matched_3 - 1, matched_3 != 0) {
            if (local_f0[limit2_3] != (uint8_t)*local_f8) {
              local_e8 = limit2_3;
              goto LAB_00128a13;
            }
            local_f8 = (ulong *)((long)local_f8 + 1);
            limit2_3 = limit2_3 + 1;
          }
          local_e8 = limit2_3;
LAB_00128a13:
          local_1e8 = local_21d8 + local_e8;
          limit2_3 = local_e8;
          iVar4 = memcmp(local_150 + max_comp_len_2,local_150 + cur_len_2,local_1e8);
          if (iVar4 != 0) {
            __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                          ,0xa2,
                          "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                         );
          }
          if ((cur_ix_masked_3 != 0) && (*local_178 < local_1e8)) {
            *local_178 = local_1e8;
            local_d0 = cur_ix_masked_3;
            local_d8 = prev_ix_masked_2;
            local_e0 = local_1e8;
            *(int *)cur_ix_masked_3 = (int)prev_ix_masked_2;
            *(int *)(cur_ix_masked_3 + 4) = (int)(local_1e8 << 5);
            cur_ix_masked_3 = cur_ix_masked_3 + 8;
          }
          if (_key_2 <= local_1e8) {
            if (prev_ix_3._4_4_ != 0) {
              local_80 = local_148;
              local_88 = node_left_2;
              local_148->forest_[node_right_2] =
                   local_148->forest_[(node_left_2 & local_148->window_mask_) * 2];
              local_50 = local_148;
              local_58 = node_left_2;
              local_148->forest_[best_len_left_2] =
                   local_148->forest_[(node_left_2 & local_148->window_mask_) * 2 + 1];
            }
            goto LAB_00128d2a;
          }
          if (local_150[cur_len_2 + local_1e8] < local_150[max_comp_len_2 + local_1e8]) {
            best_len_right_2 = local_1e8;
            if (prev_ix_3._4_4_ != 0) {
              local_148->forest_[node_right_2] = (uint32_t)node_left_2;
            }
            local_40 = local_148;
            local_48 = node_left_2;
            node_right_2 = (node_left_2 & local_148->window_mask_) * 2 + 1;
            uVar1 = local_148->forest_[node_right_2];
          }
          else {
            depth_remaining_2 = local_1e8;
            if (prev_ix_3._4_4_ != 0) {
              local_148->forest_[best_len_left_2] = (uint32_t)node_left_2;
            }
            local_70 = local_148;
            local_78 = node_left_2;
            uVar6 = node_left_2 & local_148->window_mask_;
            best_len_left_2 = uVar6 * 2;
            uVar1 = local_148->forest_[uVar6 * 2];
          }
          backward_3 = backward_3 - 1;
        }
        if (prev_ix_3._4_4_ != 0) {
          local_148->forest_[node_right_2] = local_148->invalid_pos_;
          local_148->forest_[best_len_left_2] = local_148->invalid_pos_;
        }
LAB_00128d2a:
      }
      while (local_2118 = local_2118 - 1, local_2118 != 0) {
        pos = pos + 1;
        sVar5 = HashTypeLengthH10();
        if (num_bytes <= (pos + sVar5) - 1) break;
        EvaluateNode(position,pos,max_backward_limit,dist_cache,(ZopfliCostModel *)&queue.idx_,
                     (StartPosQueue *)local_1ce0,nodes);
      }
    }
    pos = pos + 1;
  } while( true );
LAB_0012714d:
  local_528 = local_528 + 1;
  limit2_1 = limit2_1 + 8;
  goto LAB_001270cf;
LAB_00127fa4:
  local_2e0 = local_2e0 + 1;
  limit2_2 = limit2_2 + 8;
  goto LAB_00127f26;
LAB_001288b6:
  local_f8 = local_f8 + 1;
  limit2_3 = limit2_3 + 8;
  goto LAB_00128838;
LAB_00126b27:
  local_648 = local_648 + 1;
  limit2 = limit2 + 8;
  goto LAB_00126aa9;
}

Assistant:

size_t BrotliZopfliComputeShortestPath(MemoryManager* m,
                                       size_t num_bytes,
                                       size_t position,
                                       const uint8_t* ringbuffer,
                                       size_t ringbuffer_mask,
                                       const BrotliEncoderParams* params,
                                       const size_t max_backward_limit,
                                       const int* dist_cache,
                                       H10* hasher,
                                       ZopfliNode* nodes) {
  const size_t max_zopfli_len = MaxZopfliLen(params);
  ZopfliCostModel model;
  StartPosQueue queue;
  BackwardMatch matches[MAX_NUM_MATCHES_H10];
  const size_t store_end = num_bytes >= StoreLookaheadH10() ?
      position + num_bytes - StoreLookaheadH10() + 1 : position;
  size_t i;
  nodes[0].length = 0;
  nodes[0].u.cost = 0;
  InitZopfliCostModel(m, &model, num_bytes);
  if (BROTLI_IS_OOM(m)) return 0;
  ZopfliCostModelSetFromLiteralCosts(
      &model, position, ringbuffer, ringbuffer_mask);
  InitStartPosQueue(&queue);
  for (i = 0; i + HashTypeLengthH10() - 1 < num_bytes; i++) {
    const size_t pos = position + i;
    const size_t max_distance = BROTLI_MIN(size_t, pos, max_backward_limit);
    size_t num_matches = FindAllMatchesH10(hasher, ringbuffer, ringbuffer_mask,
        pos, num_bytes - i, max_distance, params, matches);
    size_t skip;
    if (num_matches > 0 &&
        BackwardMatchLength(&matches[num_matches - 1]) > max_zopfli_len) {
      matches[0] = matches[num_matches - 1];
      num_matches = 1;
    }
    skip = UpdateNodes(num_bytes, position, i, ringbuffer, ringbuffer_mask,
        params, max_backward_limit, dist_cache, num_matches, matches, &model,
        &queue, nodes);
    if (skip < BROTLI_LONG_COPY_QUICK_STEP) skip = 0;
    if (num_matches == 1 && BackwardMatchLength(&matches[0]) > max_zopfli_len) {
      skip = BROTLI_MAX(size_t, BackwardMatchLength(&matches[0]), skip);
    }
    if (skip > 1) {
      /* Add the tail of the copy to the hasher. */
      StoreRangeH10(hasher, ringbuffer, ringbuffer_mask, pos + 1, BROTLI_MIN(
          size_t, pos + skip, store_end));
      skip--;
      while (skip) {
        i++;
        if (i + HashTypeLengthH10() - 1 >= num_bytes) break;
        EvaluateNode(
            position, i, max_backward_limit, dist_cache, &model, &queue, nodes);
        skip--;
      }
    }
  }
  CleanupZopfliCostModel(m, &model);
  return ComputeShortestPathFromNodes(num_bytes, nodes);
}